

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::request_time_critical_pieces(torrent *this)

{
  piece_index_t piece;
  peer_connection **pppVar1;
  pointer ptVar2;
  pointer pppVar3;
  pointer pppVar4;
  pointer ppVar5;
  pointer ppVar6;
  bool bVar7;
  int num_blocks;
  int iVar8;
  ulong uVar9;
  long lVar10;
  time_point tVar11;
  time_duration tVar12;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  __args;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *pieces;
  undefined4 extraout_var;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_> *pvVar13;
  __normal_iterator<const_libtorrent::aux::pending_block_*,_std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>_>
  _Var14;
  time_duration tVar15;
  _Rb_tree_node_base *p_Var16;
  long lVar17;
  peer_connection **pppVar18;
  uint uVar19;
  peer_connection *ppVar20;
  pointer ptVar21;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  __i;
  long lVar22;
  pointer pppVar23;
  vector<peer_connection_*> peers;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ignore_peers;
  vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> interesting_blocks;
  downloading_piece pi;
  piece_block b;
  vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> backup;
  int local_b8;
  peer_connection *local_b0;
  piece_picker *local_a8;
  _Alloc_node local_a0;
  undefined8 local_98;
  int local_90;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ignore;
  set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
  peers_with_requests;
  
  peers.
  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  .
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  peers.
  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  .
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  peers.
  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  .
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>::
  reserve(&peers.
           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ,(long)((int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                      .
                                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->super_torrent_hot_members).m_connections.
                                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     .
                                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                 (int)((ulong)((long)(this->m_peers_to_disconnect).
                                     super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_peers_to_disconnect).
                                    super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4)));
  pppVar1 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pppVar3 = peers.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pppVar4 = peers.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pppVar18 = (this->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      peers.
      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      .
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start = pppVar3,
      peers.
      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      .
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = pppVar4, pppVar18 != pppVar1;
      pppVar18 = pppVar18 + 1) {
    bVar7 = peer_connection::can_request_time_critical(*pppVar18);
    if (bVar7) {
      if (peers.
          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          .
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          peers.
          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          .
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
        ::_M_realloc_insert<libtorrent::aux::peer_connection*const&>
                  ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                    *)&peers,
                   (iterator)
                   peers.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,pppVar18);
      }
      else {
        *peers.
         super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
         .
         super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = *pppVar18;
        peers.
        super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        .
        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             peers.
             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             .
             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    pppVar3 = peers.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pppVar4 = peers.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pppVar3 != pppVar4) {
    uVar9 = (long)pppVar4 - (long)pppVar3 >> 3;
    lVar10 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__1>>
              (pppVar3,pppVar4,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pppVar4 - (long)pppVar3 < 0x81) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__1>>
                (pppVar3,pppVar4);
    }
    else {
      pppVar23 = pppVar3 + 0x10;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__1>>
                (pppVar3,pppVar23);
      for (; pppVar23 != pppVar4; pppVar23 = pppVar23 + 1) {
        ::std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Val_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__1>>
                  (pppVar23);
      }
    }
  }
  ::std::
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>::
  resize(&peers.
          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
         ,(long)(((int)((ulong)((long)peers.
                                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                      .
                                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)peers.
                                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     .
                                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * 9 + 9) / 10)
        );
  peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header;
  peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ignore_peers.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ignore_peers.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ignore_peers.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar10 = ::std::chrono::_V2::system_clock::now();
  ptVar21 = (this->m_time_critical_pieces).
            super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ptVar2 = (this->m_time_critical_pieces).
           super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar21 != ptVar2) {
    bVar7 = true;
    do {
      if ((peers.
           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           .
           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           peers.
           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           .
           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         ((!bVar7 &&
          ((long)(this->m_average_piece_time + this->m_piece_time_deviation * 4 + 1000) * 1000000 +
           lVar10 < (ptVar21->deadline).__d.__r)))) break;
      pi.index.m_val = 0x7fffffff;
      pi.info_idx = 0xffff;
      pi._6_4_ = 0;
      pi._10_2_ = 0;
      piece_picker::piece_info
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                 (piece_index_t)(ptVar21->piece).m_val,&pi);
      num_blocks = piece_picker::blocks_in_piece
                             ((this->super_torrent_hot_members).m_picker._M_t.
                              super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                              .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                              _M_head_impl,(piece_index_t)(ptVar21->piece).m_val);
      local_b8 = 0;
      if (num_blocks ==
          ((ushort)pi._10_2_ & 0x7fff) + (pi._6_4_ & 0x7fff) + ((uint)pi._6_4_ >> 0x10 & 0x7fff)) {
        lVar17 = (ptVar21->last_requested).__d.__r;
        if (lVar17 == -0x8000000000000000) {
          (ptVar21->last_requested).__d.__r = lVar10;
          lVar17 = lVar10;
        }
        if (0 < this->m_average_piece_time) {
          uVar19 = this->m_piece_time_deviation / 2 + this->m_average_piece_time;
          if ((int)uVar19 < 2) {
            uVar19 = 1;
          }
          local_b8 = (int)(((lVar10 - lVar17) / 1000000) / (long)(ulong)uVar19);
          if ((local_b8 != 0) && ((pi._10_2_ & 0x7fff) != 0)) goto LAB_00328cd2;
        }
      }
      else {
LAB_00328cd2:
        local_a8 = (this->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
        interesting_blocks.
        super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        interesting_blocks.
        super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        interesting_blocks.
        super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        backup.super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        backup.super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        backup.super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ignore.
        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ignore.
        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ignore.
        super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        tVar11 = time_now();
        do {
          if ((peers.
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               .
               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               peers.
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               .
               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (tVar12 = peer_connection::download_queue_time
                                 (*peers.
                                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                   .
                                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,0),
             2000000000 < tVar12.__r)) break;
          local_90 = (ptVar21->piece).m_val;
          local_a0._M_t =
               (_Rb_tree<libtorrent::aux::peer_connection_*,_libtorrent::aux::peer_connection_*,_std::_Identity<libtorrent::aux::peer_connection_*>,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
                *)peer_connection::has_piece;
          local_98 = 0;
          __args = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<bool(libtorrent::aux::peer_connection::*(std::_Placeholder<1>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>))(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>)const>>>
                             (peers.
                              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              .
                              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              peers.
                              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              .
                              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&local_a0);
          if (__args._M_current ==
              peers.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) break;
          ppVar20 = *__args._M_current;
          if (interesting_blocks.
              super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              interesting_blocks.
              super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            interesting_blocks.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 interesting_blocks.
                 super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          if (backup.
              super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              backup.
              super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            backup.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 backup.
                 super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          piece.m_val = (ptVar21->piece).m_val;
          pieces = peer_connection::get_bitfield(ppVar20);
          iVar8 = (*(ppVar20->super_bandwidth_socket)._vptr_bandwidth_socket[7])(ppVar20);
          piece_picker::add_blocks
                    (local_a8,piece,pieces,&interesting_blocks,&backup,num_blocks,0,
                     (torrent_peer *)CONCAT44(extraout_var,iVar8),&ignore,(picker_options_t)0x0);
          ::std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<libtorrent::piece_block*,std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>>>
                    ((vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>> *)
                     &interesting_blocks,
                     interesting_blocks.
                     super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     backup.
                     super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     backup.
                     super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          ppVar6 = interesting_blocks.
                   super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          ppVar5 = interesting_blocks.
                   super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (interesting_blocks.
              super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              interesting_blocks.
              super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            if (local_b8 == 0) break;
            anon_unknown_135::pick_busy_blocks
                      (local_a8,(piece_index_t)(ptVar21->piece).m_val,num_blocks,local_b8,
                       &interesting_blocks,&pi);
          }
          if (interesting_blocks.
              super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              interesting_blocks.
              super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
              _M_impl.super__Vector_impl_data._M_finish) break;
          b = *interesting_blocks.
               super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pvVar13 = peer_connection::download_queue(ppVar20);
          _Var14 = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::pending_block_const*,std::vector<libtorrent::aux::pending_block,std::allocator<libtorrent::aux::pending_block>>>,__gnu_cxx::__ops::_Iter_pred<libtorrent::aux::has_block>>
                             ((pvVar13->
                              super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                              )._M_impl.super__Vector_impl_data._M_start,
                              (pvVar13->
                              super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                              )._M_impl.super__Vector_impl_data._M_finish,&b);
          if (_Var14._M_current ==
              (pvVar13->
              super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            pvVar13 = peer_connection::request_queue(ppVar20);
            _Var14 = ::std::
                     __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::pending_block_const*,std::vector<libtorrent::aux::pending_block,std::allocator<libtorrent::aux::pending_block>>>,__gnu_cxx::__ops::_Iter_pred<libtorrent::aux::has_block>>
                               ((pvVar13->
                                super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                                (pvVar13->
                                super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                                )._M_impl.super__Vector_impl_data._M_finish,&b);
            if (_Var14._M_current ==
                (pvVar13->
                super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              bVar7 = peer_connection::add_request
                                (ppVar20,&b,(request_flags_t)((ppVar5 == ppVar6) * '\x02' + '\x01'))
              ;
              if (bVar7) {
                local_a0._M_t = &peers_with_requests._M_t;
                local_b0 = ppVar20;
                ::std::
                _Rb_tree<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*,std::_Identity<libtorrent::aux::peer_connection*>,std::less<libtorrent::aux::peer_connection*>,std::allocator<libtorrent::aux::peer_connection*>>
                ::
                _M_insert_unique_<libtorrent::aux::peer_connection*,std::_Rb_tree<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*,std::_Identity<libtorrent::aux::peer_connection*>,std::less<libtorrent::aux::peer_connection*>,std::allocator<libtorrent::aux::peer_connection*>>::_Alloc_node>
                          ((_Rb_tree<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*,std::_Identity<libtorrent::aux::peer_connection*>,std::less<libtorrent::aux::peer_connection*>,std::allocator<libtorrent::aux::peer_connection*>>
                            *)local_a0._M_t,
                           (const_iterator)
                           peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                           &local_b0,&local_a0);
                goto LAB_00328fbd;
              }
              if (ignore_peers.
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  ignore_peers.
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00328ec4;
              ::std::
              vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
              ::_M_realloc_insert<libtorrent::aux::peer_connection*const&>
                        ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                          *)&ignore_peers,
                         (iterator)
                         ignore_peers.
                         super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__args._M_current);
              goto LAB_00329096;
            }
            bVar7 = peer_connection::make_time_critical(ppVar20,&b);
            if (!bVar7) {
              if (ignore_peers.
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  ignore_peers.
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00328ec4;
              ::std::
              vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
              ::_M_realloc_insert<libtorrent::aux::peer_connection*const&>
                        ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                          *)&ignore_peers,
                         (iterator)
                         ignore_peers.
                         super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__args._M_current);
              goto LAB_00329096;
            }
            (ptVar21->last_requested).__d.__r = (rep)tVar11.__d.__r;
            local_a0._M_t = &peers_with_requests._M_t;
            local_b0 = ppVar20;
            ::std::
            _Rb_tree<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*,std::_Identity<libtorrent::aux::peer_connection*>,std::less<libtorrent::aux::peer_connection*>,std::allocator<libtorrent::aux::peer_connection*>>
            ::
            _M_insert_unique_<libtorrent::aux::peer_connection*,std::_Rb_tree<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*,std::_Identity<libtorrent::aux::peer_connection*>,std::less<libtorrent::aux::peer_connection*>,std::allocator<libtorrent::aux::peer_connection*>>::_Alloc_node>
                      ((_Rb_tree<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*,std::_Identity<libtorrent::aux::peer_connection*>,std::less<libtorrent::aux::peer_connection*>,std::allocator<libtorrent::aux::peer_connection*>>
                        *)local_a0._M_t,
                       (const_iterator)
                       peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       &local_b0,&local_a0);
LAB_00328fbd:
            if (ppVar5 != ppVar6) {
              (ptVar21->last_requested).__d.__r = (rep)tVar11.__d.__r;
            }
            if ((ptVar21->first_requested).__d.__r == -0x8000000000000000) {
              (ptVar21->first_requested).__d.__r = (rep)tVar11.__d.__r;
            }
            bVar7 = peer_connection::can_request_time_critical(ppVar20);
            if (!bVar7) goto LAB_00329096;
            if (__args._M_current !=
                peers.
                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                .
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1) {
              ppVar20 = *__args._M_current;
              do {
                tVar12 = peer_connection::download_queue_time(ppVar20,0);
                tVar15 = peer_connection::download_queue_time(__args._M_current[1],0);
                if (tVar12.__r <= tVar15.__r) break;
                ppVar20 = *__args._M_current;
                *__args._M_current = __args._M_current[1];
                __args._M_current[1] = ppVar20;
                __args._M_current = __args._M_current + 1;
              } while (__args._M_current !=
                       peers.
                       super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       .
                       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
            }
          }
          else {
            if (ignore_peers.
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                ignore_peers.
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::
              vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
              ::_M_realloc_insert<libtorrent::aux::peer_connection*const&>
                        ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                          *)&ignore_peers,
                         (iterator)
                         ignore_peers.
                         super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__args._M_current);
            }
            else {
LAB_00328ec4:
              *ignore_peers.
               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish = *__args._M_current;
              ignore_peers.
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   ignore_peers.
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
LAB_00329096:
            pppVar18 = __args._M_current + 1;
            if (pppVar18 !=
                peers.
                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                .
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              memmove(__args._M_current,pppVar18,
                      (long)peers.
                            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            .
                            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pppVar18);
            }
            peers.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 peers.
                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 .
                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
          }
        } while (interesting_blocks.
                 super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 interesting_blocks.
                 super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        if (ignore.
            super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(ignore.
                          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)ignore.
                                super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)ignore.
                                super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (backup.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(backup.
                          super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)backup.
                                super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)backup.
                                super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (interesting_blocks.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(interesting_blocks.
                          super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)interesting_blocks.
                                super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)interesting_blocks.
                                super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (ignore_peers.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            ignore_peers.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ::std::
          vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>>
                    ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                      *)&peers);
          pppVar4 = peers.
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    .
                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pppVar3 = peers.
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    .
                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (ignore_peers.
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              ignore_peers.
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            ignore_peers.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 ignore_peers.
                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          if (peers.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              peers.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            lVar22 = (long)peers.
                           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           .
                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)peers.
                           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           .
                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar9 = lVar22 >> 3;
            lVar17 = 0x3f;
            if (uVar9 != 0) {
              for (; uVar9 >> lVar17 == 0; lVar17 = lVar17 + -1) {
              }
            }
            ::std::
            __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__2>>
                      (peers.
                       super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       .
                       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       peers.
                       super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       .
                       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar22 < 0x81) {
              ::std::
              __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__2>>
                        (pppVar3);
            }
            else {
              pppVar23 = pppVar3 + 0x10;
              ::std::
              __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__2>>
                        (pppVar3);
              for (; pppVar23 != pppVar4; pppVar23 = pppVar23 + 1) {
                ::std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Val_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__2>>
                          (pppVar23);
              }
            }
          }
        }
        if ((peers.
             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             .
             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             peers.
             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             .
             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (tVar12 = peer_connection::download_queue_time
                               (*peers.
                                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 .
                                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start,0),
           2000000000 < tVar12.__r)) break;
      }
      ptVar21 = ptVar21 + 1;
      bVar7 = false;
    } while (ptVar21 != ptVar2);
  }
  for (p_Var16 = peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var16 != &peers_with_requests._M_t._M_impl.super__Rb_tree_header;
      p_Var16 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var16)) {
    peer_connection::send_block_requests(*(peer_connection **)(p_Var16 + 1));
  }
  if (ignore_peers.
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(ignore_peers.
                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)ignore_peers.
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)ignore_peers.
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  _Rb_tree<libtorrent::aux::peer_connection_*,_libtorrent::aux::peer_connection_*,_std::_Identity<libtorrent::aux::peer_connection_*>,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ::~_Rb_tree(&peers_with_requests._M_t);
  if (peers.
      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      .
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(peers.
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    .
                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)peers.
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          .
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)peers.
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          .
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void torrent::request_time_critical_pieces()
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(!upload_mode());

		// build a list of peers and sort it by download_queue_time
		// we use this sorted list to determine which peer we should
		// request a block from. The earlier a peer is in the list,
		// the sooner we will fully download the block we request.
		aux::vector<peer_connection*> peers;
		peers.reserve(num_peers());

		// some peers are marked as not being able to request time critical
		// blocks from. For instance, peers that have choked us, peers that are
		// on parole (i.e. they are believed to have sent us bad data), peers
		// that are being disconnected, in upload mode etc.
		std::remove_copy_if(m_connections.begin(), m_connections.end()
			, std::back_inserter(peers), [] (peer_connection* p)
			{ return !p->can_request_time_critical(); });

		// sort by the time we believe it will take this peer to send us all
		// blocks we've requested from it. The shorter time, the better candidate
		// it is to request a time critical block from.
		std::sort(peers.begin(), peers.end()
			, [] (peer_connection const* lhs, peer_connection const* rhs)
			{ return lhs->download_queue_time(16*1024) < rhs->download_queue_time(16*1024); });

		// remove the bottom 10% of peers from the candidate set.
		// this is just to remove outliers that might stall downloads
		int const new_size = (peers.end_index() * 9 + 9) / 10;
		TORRENT_ASSERT(new_size <= peers.end_index());
		peers.resize(new_size);

		// remember all the peers we issued requests to, so we can commit them
		// at the end of this function. Instead of sending the requests right
		// away, we batch them up and send them in a single write to the TCP
		// socket, increasing the chance that they will all be sent in the same
		// packet.
		std::set<peer_connection*> peers_with_requests;

		// peers that should be temporarily ignored for a specific piece
		// in order to give priority to other peers. They should be used for
		// subsequent pieces, so they are stored in this vector until the
		// piece is done
		std::vector<peer_connection*> ignore_peers;

		time_point const now = clock_type::now();

		// now, iterate over all time critical pieces, in order of importance, and
		// request them from the peers, in order of responsiveness. i.e. request
		// the most time critical pieces from the fastest peers.
		bool first_piece{true};
		for (auto& i : m_time_critical_pieces)
		{
#if TORRENT_DEBUG_STREAMING > 1
			std::printf("considering %d\n", i->piece);
#endif

			if (peers.empty())
			{
#if TORRENT_DEBUG_STREAMING > 1
				std::printf("out of peers, done\n");
#endif
				break;
			}

			// the +1000 is to compensate for the fact that we only call this
			// function once per second, so if we need to request it 500 ms from
			// now, we should request it right away
			if (!first_piece && i.deadline > now
				+ milliseconds(m_average_piece_time + m_piece_time_deviation * 4 + 1000))
			{
				// don't request pieces whose deadline is too far in the future
				// this is one of the termination conditions. We don't want to
				// send requests for all pieces in the torrent right away
#if TORRENT_DEBUG_STREAMING > 0
				std::printf("reached deadline horizon [%f + %f * 4 + 1]\n"
					, m_average_piece_time / 1000.f
					, m_piece_time_deviation / 1000.f);
#endif
				break;
			}
			first_piece = false;

			piece_picker::downloading_piece pi;
			m_picker->piece_info(i.piece, pi);

			// the number of "times" this piece has timed out.
			int timed_out = 0;

			int const blocks_in_piece = m_picker->blocks_in_piece(i.piece);

#if TORRENT_DEBUG_STREAMING > 0
			i.timed_out = timed_out;
#endif
			int const free_to_request = blocks_in_piece
				- pi.finished - pi.writing - pi.requested;

			if (free_to_request == 0)
			{
				if (i.last_requested == min_time())
					i.last_requested = now;

				// if it's been more than half of the typical download time
				// of a piece since we requested the last block, allow
				// one more request per block
				if (m_average_piece_time > 0)
					timed_out = int(total_milliseconds(now - i.last_requested)
						/ std::max(int(m_average_piece_time + m_piece_time_deviation / 2), 1));

#if TORRENT_DEBUG_STREAMING > 0
				i.timed_out = timed_out;
#endif
				// every block in this piece is already requested
				// there's no need to consider this piece, unless it
				// appears to be stalled.
				if (pi.requested == 0 || timed_out == 0)
				{
#if TORRENT_DEBUG_STREAMING > 1
					std::printf("skipping %d (full) [req: %d timed_out: %d ]\n"
						, i.piece, pi.requested
						, timed_out);
#endif

					// if requested is 0, it means all blocks have been received, and
					// we're just waiting for it to flush them to disk.
					// if last_requested is recent enough, we should give it some
					// more time
					// skip to the next piece
					continue;
				}

				// it's been too long since we requested the last block from
				// this piece. Allow re-requesting blocks from this piece
#if TORRENT_DEBUG_STREAMING > 1
				std::printf("timed out [average-piece-time: %d ms ]\n"
					, m_average_piece_time);
#endif
			}

			// pick all blocks for this piece. the peers list is kept up to date
			// and sorted. when we issue a request to a peer, its download queue
			// time will increase and it may need to be bumped in the peers list,
			// since it's ordered by download queue time
			pick_time_critical_block(peers, ignore_peers
				, peers_with_requests
				, pi, &i, m_picker.get()
				, blocks_in_piece, timed_out);

			// put back the peers we ignored into the peer list for the next piece
			if (!ignore_peers.empty())
			{
				peers.insert(peers.begin(), ignore_peers.begin(), ignore_peers.end());
				ignore_peers.clear();

				// TODO: instead of resorting the whole list, insert the peers
				// directly into the right place
				std::sort(peers.begin(), peers.end()
					, [] (peer_connection const* lhs, peer_connection const* rhs)
					{ return lhs->download_queue_time(16*1024) < rhs->download_queue_time(16*1024); });
			}

			// if this peer's download time exceeds 2 seconds, we're done.
			// We don't want to build unreasonably long request queues
			if (!peers.empty() && peers[0]->download_queue_time() > milliseconds(2000))
				break;
		}

		// commit all the time critical requests
		for (auto* p : peers_with_requests)
		{
			p->send_block_requests();
		}
	}